

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 (*pauVar66) [16];
  undefined4 uVar67;
  uint uVar68;
  AABBNodeMB4D *node1;
  ulong uVar69;
  long lVar70;
  long lVar71;
  ulong uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  int iVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  long lVar95;
  ulong uVar96;
  float fVar97;
  float fVar105;
  float fVar106;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  float fVar107;
  float fVar108;
  undefined1 auVar109 [16];
  float fVar117;
  float fVar119;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar112 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [32];
  float fVar118;
  float fVar120;
  float fVar121;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar132;
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar151;
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar147 [32];
  undefined1 auVar146 [16];
  undefined1 auVar148 [32];
  float fVar153;
  float fVar157;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar166;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar180;
  float fVar181;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar183 [64];
  float fVar196;
  float fVar197;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [64];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar210;
  undefined1 auVar211 [32];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar212 [64];
  float fVar219;
  float fVar220;
  undefined1 auVar221 [32];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar222 [64];
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar237 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_16e8) [16];
  ulong local_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 local_1610;
  undefined8 uStack_1608;
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined1 local_1590 [16];
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [8];
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [8];
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [8];
  float fStack_1328;
  float fStack_1324;
  undefined1 local_1320 [8];
  float fStack_1318;
  float fStack_1314;
  undefined1 local_1310 [8];
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_16e8 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar67 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1370._4_4_ = uVar67;
  local_1370._0_4_ = uVar67;
  local_1370._8_4_ = uVar67;
  local_1370._12_4_ = uVar67;
  auVar179 = ZEXT1664(local_1370);
  uVar67 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = uVar67;
  local_1380._0_4_ = uVar67;
  local_1380._8_4_ = uVar67;
  local_1380._12_4_ = uVar67;
  auVar183 = ZEXT1664(local_1380);
  uVar67 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1390._4_4_ = uVar67;
  local_1390._0_4_ = uVar67;
  local_1390._8_4_ = uVar67;
  local_1390._12_4_ = uVar67;
  auVar201 = ZEXT1664(local_1390);
  fVar108 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar98 = ZEXT416((uint)(fVar108 * 0.99999964));
  local_13a0 = vshufps_avx(auVar98,auVar98,0);
  auVar209 = ZEXT1664(local_13a0);
  auVar98 = ZEXT416((uint)(fVar118 * 0.99999964));
  local_13b0 = vshufps_avx(auVar98,auVar98,0);
  auVar212 = ZEXT1664(local_13b0);
  auVar98 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_13c0 = vshufps_avx(auVar98,auVar98,0);
  auVar222 = ZEXT1664(local_13c0);
  auVar98 = ZEXT416((uint)(fVar108 * 1.0000004));
  local_13d0 = vshufps_avx(auVar98,auVar98,0);
  auVar237 = ZEXT1664(local_13d0);
  auVar98 = ZEXT416((uint)(fVar118 * 1.0000004));
  local_13e0 = vshufps_avx(auVar98,auVar98,0);
  auVar246 = ZEXT1664(local_13e0);
  auVar98 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_13f0 = vshufps_avx(auVar98,auVar98,0);
  auVar248 = ZEXT1664(local_13f0);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar96 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar77 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar76 = (tray->tnear).field_0.i[k];
  local_1590._4_4_ = iVar76;
  local_1590._0_4_ = iVar76;
  local_1590._8_4_ = iVar76;
  local_1590._12_4_ = iVar76;
  auVar176 = ZEXT1664(local_1590);
  iVar76 = (tray->tfar).field_0.i[k];
  auVar104 = ZEXT1664(CONCAT412(iVar76,CONCAT48(iVar76,CONCAT44(iVar76,iVar76))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar74 = 1 << ((byte)k & 0x1f);
  uVar72 = (ulong)((uVar74 & 0xf) << 4);
  lVar73 = (long)((int)uVar74 >> 4) * 0x10;
  auVar147._8_4_ = 0x3f800000;
  auVar147._0_8_ = &DAT_3f8000003f800000;
  auVar147._12_4_ = 0x3f800000;
  auVar147._16_4_ = 0x3f800000;
  auVar147._20_4_ = 0x3f800000;
  auVar147._24_4_ = 0x3f800000;
  auVar147._28_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar112._16_4_ = 0xbf800000;
  auVar112._20_4_ = 0xbf800000;
  auVar112._24_4_ = 0xbf800000;
  auVar112._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar147,auVar112,local_1100);
  do {
    do {
      do {
        if (local_16e8 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar66 = local_16e8 + -1;
        local_16e8 = local_16e8 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar66 + 8));
      uVar94 = *(ulong *)*local_16e8;
      do {
        if ((uVar94 & 8) == 0) {
          uVar69 = uVar94 & 0xfffffffffffffff0;
          fVar108 = *(float *)(ray + k * 4 + 0xe0);
          auVar109._4_4_ = fVar108;
          auVar109._0_4_ = fVar108;
          auVar109._8_4_ = fVar108;
          auVar109._12_4_ = fVar108;
          pfVar2 = (float *)(uVar69 + 0x80 + uVar75);
          pfVar1 = (float *)(uVar69 + 0x20 + uVar75);
          auVar98._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar98._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar98._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar98._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar98 = vsubps_avx(auVar98,auVar179._0_16_);
          auVar110._0_4_ = auVar209._0_4_ * auVar98._0_4_;
          auVar110._4_4_ = auVar209._4_4_ * auVar98._4_4_;
          auVar110._8_4_ = auVar209._8_4_ * auVar98._8_4_;
          auVar110._12_4_ = auVar209._12_4_ * auVar98._12_4_;
          auVar98 = vmaxps_avx(auVar176._0_16_,auVar110);
          pfVar2 = (float *)(uVar69 + 0x80 + uVar96);
          pfVar1 = (float *)(uVar69 + 0x20 + uVar96);
          auVar142._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar142._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar142._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar142._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar110 = vsubps_avx(auVar142,auVar183._0_16_);
          auVar143._0_4_ = auVar212._0_4_ * auVar110._0_4_;
          auVar143._4_4_ = auVar212._4_4_ * auVar110._4_4_;
          auVar143._8_4_ = auVar212._8_4_ * auVar110._8_4_;
          auVar143._12_4_ = auVar212._12_4_ * auVar110._12_4_;
          pfVar2 = (float *)(uVar69 + 0x80 + uVar77);
          pfVar1 = (float *)(uVar69 + 0x20 + uVar77);
          auVar158._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar158._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar158._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar158._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar110 = vsubps_avx(auVar158,auVar201._0_16_);
          auVar159._0_4_ = auVar222._0_4_ * auVar110._0_4_;
          auVar159._4_4_ = auVar222._4_4_ * auVar110._4_4_;
          auVar159._8_4_ = auVar222._8_4_ * auVar110._8_4_;
          auVar159._12_4_ = auVar222._12_4_ * auVar110._12_4_;
          auVar110 = vmaxps_avx(auVar143,auVar159);
          auVar98 = vmaxps_avx(auVar98,auVar110);
          pfVar2 = (float *)(uVar69 + 0x80 + (uVar75 ^ 0x10));
          pfVar1 = (float *)(uVar69 + 0x20 + (uVar75 ^ 0x10));
          auVar144._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar144._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar144._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar144._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar110 = vsubps_avx(auVar144,auVar179._0_16_);
          auVar145._0_4_ = auVar237._0_4_ * auVar110._0_4_;
          auVar145._4_4_ = auVar237._4_4_ * auVar110._4_4_;
          auVar145._8_4_ = auVar237._8_4_ * auVar110._8_4_;
          auVar145._12_4_ = auVar237._12_4_ * auVar110._12_4_;
          pfVar2 = (float *)(uVar69 + 0x80 + (uVar96 ^ 0x10));
          pfVar1 = (float *)(uVar69 + 0x20 + (uVar96 ^ 0x10));
          auVar160._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar160._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar160._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar160._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar110 = vsubps_avx(auVar160,auVar183._0_16_);
          auVar161._0_4_ = auVar246._0_4_ * auVar110._0_4_;
          auVar161._4_4_ = auVar246._4_4_ * auVar110._4_4_;
          auVar161._8_4_ = auVar246._8_4_ * auVar110._8_4_;
          auVar161._12_4_ = auVar246._12_4_ * auVar110._12_4_;
          pfVar2 = (float *)(uVar69 + 0x80 + (uVar77 ^ 0x10));
          pfVar1 = (float *)(uVar69 + 0x20 + (uVar77 ^ 0x10));
          auVar167._0_4_ = fVar108 * *pfVar2 + *pfVar1;
          auVar167._4_4_ = fVar108 * pfVar2[1] + pfVar1[1];
          auVar167._8_4_ = fVar108 * pfVar2[2] + pfVar1[2];
          auVar167._12_4_ = fVar108 * pfVar2[3] + pfVar1[3];
          auVar110 = vsubps_avx(auVar167,auVar201._0_16_);
          auVar168._0_4_ = auVar248._0_4_ * auVar110._0_4_;
          auVar168._4_4_ = auVar248._4_4_ * auVar110._4_4_;
          auVar168._8_4_ = auVar248._8_4_ * auVar110._8_4_;
          auVar168._12_4_ = auVar248._12_4_ * auVar110._12_4_;
          auVar110 = vminps_avx(auVar161,auVar168);
          auVar142 = vminps_avx(auVar104._0_16_,auVar145);
          auVar110 = vminps_avx(auVar142,auVar110);
          if (((uint)uVar94 & 7) == 6) {
            auVar142 = vcmpps_avx(auVar98,auVar110,2);
            auVar110 = vcmpps_avx(*(undefined1 (*) [16])(uVar69 + 0xe0),auVar109,2);
            auVar109 = vcmpps_avx(auVar109,*(undefined1 (*) [16])(uVar69 + 0xf0),1);
            auVar110 = vandps_avx(auVar110,auVar109);
            auVar110 = vandps_avx(auVar110,auVar142);
          }
          else {
            auVar110 = vcmpps_avx(auVar98,auVar110,2);
          }
          auVar110 = vpslld_avx(auVar110,0x1f);
          uVar67 = vmovmskps_avx(auVar110);
          local_1628 = CONCAT44((int)(uVar69 >> 0x20),uVar67);
          local_12e0._0_16_ = auVar98;
        }
        if ((uVar94 & 8) == 0) {
          if (local_1628 == 0) {
            iVar76 = 4;
          }
          else {
            uVar69 = uVar94 & 0xfffffffffffffff0;
            lVar71 = 0;
            if (local_1628 != 0) {
              for (; (local_1628 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
              }
            }
            iVar76 = 0;
            uVar94 = *(ulong *)(uVar69 + lVar71 * 8);
            uVar85 = local_1628 - 1 & local_1628;
            if (uVar85 != 0) {
              uVar74 = *(uint *)(local_12e0 + lVar71 * 4);
              lVar71 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                }
              }
              uVar78 = *(ulong *)(uVar69 + lVar71 * 8);
              uVar68 = *(uint *)(local_12e0 + lVar71 * 4);
              uVar85 = uVar85 - 1 & uVar85;
              if (uVar85 == 0) {
                if (uVar74 < uVar68) {
                  *(ulong *)*local_16e8 = uVar78;
                  *(uint *)(*local_16e8 + 8) = uVar68;
                  local_16e8 = local_16e8 + 1;
                }
                else {
                  *(ulong *)*local_16e8 = uVar94;
                  *(uint *)(*local_16e8 + 8) = uVar74;
                  uVar94 = uVar78;
                  local_16e8 = local_16e8 + 1;
                }
              }
              else {
                auVar111._8_8_ = 0;
                auVar111._0_8_ = uVar94;
                auVar98 = vpunpcklqdq_avx(auVar111,ZEXT416(uVar74));
                auVar125._8_8_ = 0;
                auVar125._0_8_ = uVar78;
                auVar110 = vpunpcklqdq_avx(auVar125,ZEXT416(uVar68));
                lVar71 = 0;
                if (uVar85 != 0) {
                  for (; (uVar85 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                  }
                }
                auVar146._8_8_ = 0;
                auVar146._0_8_ = *(ulong *)(uVar69 + lVar71 * 8);
                auVar109 = vpunpcklqdq_avx(auVar146,ZEXT416(*(uint *)(local_12e0 + lVar71 * 4)));
                auVar142 = vpcmpgtd_avx(auVar110,auVar98);
                uVar85 = uVar85 - 1 & uVar85;
                if (uVar85 == 0) {
                  auVar143 = vpshufd_avx(auVar142,0xaa);
                  auVar142 = vblendvps_avx(auVar110,auVar98,auVar143);
                  auVar98 = vblendvps_avx(auVar98,auVar110,auVar143);
                  auVar110 = vpcmpgtd_avx(auVar109,auVar142);
                  auVar143 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar109,auVar142,auVar143);
                  auVar142 = vblendvps_avx(auVar142,auVar109,auVar143);
                  auVar109 = vpcmpgtd_avx(auVar142,auVar98);
                  auVar143 = vpshufd_avx(auVar109,0xaa);
                  auVar109 = vblendvps_avx(auVar142,auVar98,auVar143);
                  auVar98 = vblendvps_avx(auVar98,auVar142,auVar143);
                  *local_16e8 = auVar98;
                  local_16e8[1] = auVar109;
                  uVar94 = auVar110._0_8_;
                  local_16e8 = local_16e8 + 2;
                }
                else {
                  lVar71 = 0;
                  if (uVar85 != 0) {
                    for (; (uVar85 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                    }
                  }
                  auVar169._8_8_ = 0;
                  auVar169._0_8_ = *(ulong *)(uVar69 + lVar71 * 8);
                  auVar144 = vpunpcklqdq_avx(auVar169,ZEXT416(*(uint *)(local_12e0 + lVar71 * 4)));
                  auVar143 = vpshufd_avx(auVar142,0xaa);
                  auVar142 = vblendvps_avx(auVar110,auVar98,auVar143);
                  auVar98 = vblendvps_avx(auVar98,auVar110,auVar143);
                  auVar110 = vpcmpgtd_avx(auVar144,auVar109);
                  auVar143 = vpshufd_avx(auVar110,0xaa);
                  auVar110 = vblendvps_avx(auVar144,auVar109,auVar143);
                  auVar109 = vblendvps_avx(auVar109,auVar144,auVar143);
                  auVar143 = vpcmpgtd_avx(auVar109,auVar98);
                  auVar144 = vpshufd_avx(auVar143,0xaa);
                  auVar143 = vblendvps_avx(auVar109,auVar98,auVar144);
                  auVar98 = vblendvps_avx(auVar98,auVar109,auVar144);
                  auVar109 = vpcmpgtd_avx(auVar110,auVar142);
                  auVar144 = vpshufd_avx(auVar109,0xaa);
                  auVar109 = vblendvps_avx(auVar110,auVar142,auVar144);
                  auVar110 = vblendvps_avx(auVar142,auVar110,auVar144);
                  auVar142 = vpcmpgtd_avx(auVar143,auVar110);
                  auVar144 = vpshufd_avx(auVar142,0xaa);
                  auVar142 = vblendvps_avx(auVar143,auVar110,auVar144);
                  auVar110 = vblendvps_avx(auVar110,auVar143,auVar144);
                  *local_16e8 = auVar98;
                  local_16e8[1] = auVar110;
                  local_16e8[2] = auVar142;
                  auVar176 = ZEXT1664(local_1590);
                  uVar94 = auVar109._0_8_;
                  local_16e8 = local_16e8 + 3;
                }
              }
            }
          }
        }
        else {
          iVar76 = 6;
        }
      } while (iVar76 == 0);
    } while (iVar76 != 6);
    uVar69 = (ulong)((uint)uVar94 & 0xf);
    if (uVar69 != 8) {
      uVar94 = uVar94 & 0xfffffffffffffff0;
      lVar71 = 0;
      do {
        lVar70 = lVar71 * 0x60;
        pSVar5 = context->scene;
        pRVar6 = (pSVar5->geometries).items;
        pGVar7 = pRVar6[*(uint *)(uVar94 + 0x40 + lVar70)].ptr;
        fVar108 = (pGVar7->time_range).lower;
        fVar108 = pGVar7->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0xe0) - fVar108) /
                  ((pGVar7->time_range).upper - fVar108));
        auVar98 = vroundss_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),9);
        auVar98 = vminss_avx(auVar98,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
        auVar168 = vmaxss_avx(ZEXT816(0) << 0x20,auVar98);
        iVar76 = (int)auVar168._0_4_;
        lVar86 = (long)iVar76 * 0x38;
        lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar86);
        uVar84 = (ulong)*(uint *)(uVar94 + 4 + lVar70);
        auVar98 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar94 + lVar70) * 4);
        uVar85 = (ulong)*(uint *)(uVar94 + 0x10 + lVar70);
        auVar110 = *(undefined1 (*) [16])(lVar8 + uVar85 * 4);
        uVar78 = (ulong)*(uint *)(uVar94 + 0x20 + lVar70);
        auVar142 = *(undefined1 (*) [16])(lVar8 + uVar78 * 4);
        uVar79 = (ulong)*(uint *)(uVar94 + 0x30 + lVar70);
        auVar109 = *(undefined1 (*) [16])(lVar8 + uVar79 * 4);
        lVar8 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x44 + lVar70)].ptr[2].numPrimitives;
        lVar9 = *(long *)(lVar8 + lVar86);
        auVar143 = *(undefined1 (*) [16])(lVar9 + uVar84 * 4);
        uVar80 = (ulong)*(uint *)(uVar94 + 0x14 + lVar70);
        auVar144 = *(undefined1 (*) [16])(lVar9 + uVar80 * 4);
        uVar81 = (ulong)*(uint *)(uVar94 + 0x24 + lVar70);
        auVar145 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
        uVar82 = (ulong)*(uint *)(uVar94 + 0x34 + lVar70);
        auVar158 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
        lVar9 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x48 + lVar70)].ptr[2].numPrimitives;
        lVar10 = *(long *)(lVar9 + lVar86);
        uVar83 = (ulong)*(uint *)(uVar94 + 8 + lVar70);
        auVar159 = *(undefined1 (*) [16])(lVar10 + uVar83 * 4);
        uVar88 = (ulong)*(uint *)(uVar94 + 0x18 + lVar70);
        auVar160 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
        uVar89 = (ulong)*(uint *)(uVar94 + 0x28 + lVar70);
        auVar161 = *(undefined1 (*) [16])(lVar10 + uVar89 * 4);
        uVar90 = (ulong)*(uint *)(uVar94 + 0x38 + lVar70);
        auVar167 = *(undefined1 (*) [16])(lVar10 + uVar90 * 4);
        fVar108 = fVar108 - auVar168._0_4_;
        lVar10 = *(long *)&pRVar6[*(uint *)(uVar94 + 0x4c + lVar70)].ptr[2].numPrimitives;
        lVar86 = *(long *)(lVar10 + lVar86);
        uVar87 = (ulong)*(uint *)(uVar94 + 0xc + lVar70);
        auVar168 = *(undefined1 (*) [16])(lVar86 + uVar87 * 4);
        uVar92 = (ulong)*(uint *)(uVar94 + 0x1c + lVar70);
        auVar111 = *(undefined1 (*) [16])(lVar86 + uVar92 * 4);
        auVar125 = vunpcklps_avx(auVar98,auVar159);
        auVar159 = vunpckhps_avx(auVar98,auVar159);
        auVar146 = vunpcklps_avx(auVar143,auVar168);
        auVar143 = vunpckhps_avx(auVar143,auVar168);
        uVar91 = (ulong)*(uint *)(uVar94 + 0x2c + lVar70);
        auVar98 = *(undefined1 (*) [16])(lVar86 + uVar91 * 4);
        auVar168 = vunpcklps_avx(auVar159,auVar143);
        _local_1310 = vunpcklps_avx(auVar125,auVar146);
        auVar143 = vunpckhps_avx(auVar125,auVar146);
        auVar125 = vunpcklps_avx(auVar110,auVar160);
        auVar159 = vunpckhps_avx(auVar110,auVar160);
        auVar160 = vunpcklps_avx(auVar144,auVar111);
        auVar144 = vunpckhps_avx(auVar144,auVar111);
        uVar93 = (ulong)*(uint *)(uVar94 + 0x3c + lVar70);
        auVar110 = *(undefined1 (*) [16])(lVar86 + uVar93 * 4);
        auVar159 = vunpcklps_avx(auVar159,auVar144);
        auVar111 = vunpcklps_avx(auVar125,auVar160);
        auVar144 = vunpckhps_avx(auVar125,auVar160);
        auVar160 = vunpcklps_avx(auVar142,auVar161);
        auVar142 = vunpckhps_avx(auVar142,auVar161);
        auVar161 = vunpcklps_avx(auVar145,auVar98);
        auVar145 = vunpckhps_avx(auVar145,auVar98);
        lVar95 = (long)(iVar76 + 1) * 0x38;
        lVar86 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar95);
        auVar98 = *(undefined1 (*) [16])(lVar86 + (ulong)*(uint *)(uVar94 + lVar70) * 4);
        _local_1320 = vunpcklps_avx(auVar142,auVar145);
        _local_1360 = vunpcklps_avx(auVar160,auVar161);
        _local_1350 = vunpckhps_avx(auVar160,auVar161);
        auVar145 = vunpcklps_avx(auVar109,auVar167);
        auVar142 = vunpckhps_avx(auVar109,auVar167);
        auVar160 = vunpcklps_avx(auVar158,auVar110);
        auVar109 = vunpckhps_avx(auVar158,auVar110);
        lVar9 = *(long *)(lVar9 + lVar95);
        auVar110 = *(undefined1 (*) [16])(lVar9 + uVar83 * 4);
        _local_1330 = vunpcklps_avx(auVar142,auVar109);
        auVar161 = vunpcklps_avx(auVar145,auVar160);
        _local_1340 = vunpckhps_avx(auVar145,auVar160);
        lVar8 = *(long *)(lVar8 + lVar95);
        auVar109 = vunpcklps_avx(auVar98,auVar110);
        auVar142 = vunpckhps_avx(auVar98,auVar110);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar84 * 4);
        lVar10 = *(long *)(lVar10 + lVar95);
        auVar110 = *(undefined1 (*) [16])(lVar10 + uVar87 * 4);
        auVar145 = vunpcklps_avx(auVar98,auVar110);
        auVar98 = vunpckhps_avx(auVar98,auVar110);
        auVar160 = vunpcklps_avx(auVar142,auVar98);
        auVar167 = vunpcklps_avx(auVar109,auVar145);
        auVar142 = vunpckhps_avx(auVar109,auVar145);
        auVar98 = *(undefined1 (*) [16])(lVar86 + uVar85 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar9 + uVar88 * 4);
        auVar145 = vunpcklps_avx(auVar98,auVar110);
        auVar109 = vunpckhps_avx(auVar98,auVar110);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar80 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar10 + uVar92 * 4);
        auVar158 = vunpcklps_avx(auVar98,auVar110);
        auVar98 = vunpckhps_avx(auVar98,auVar110);
        auVar125 = vunpcklps_avx(auVar109,auVar98);
        auVar146 = vunpcklps_avx(auVar145,auVar158);
        auVar109 = vunpckhps_avx(auVar145,auVar158);
        auVar98 = *(undefined1 (*) [16])(lVar86 + uVar78 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar9 + uVar89 * 4);
        auVar158 = vunpcklps_avx(auVar98,auVar110);
        auVar145 = vunpckhps_avx(auVar98,auVar110);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar81 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar10 + uVar91 * 4);
        auVar169 = vunpcklps_avx(auVar98,auVar110);
        auVar98 = vunpckhps_avx(auVar98,auVar110);
        auVar99 = vunpcklps_avx(auVar145,auVar98);
        auVar162 = vunpcklps_avx(auVar158,auVar169);
        auVar145 = vunpckhps_avx(auVar158,auVar169);
        auVar98 = *(undefined1 (*) [16])(lVar86 + uVar79 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar9 + uVar90 * 4);
        auVar169 = vunpcklps_avx(auVar98,auVar110);
        auVar158 = vunpckhps_avx(auVar98,auVar110);
        auVar98 = *(undefined1 (*) [16])(lVar8 + uVar82 * 4);
        auVar110 = *(undefined1 (*) [16])(lVar10 + uVar93 * 4);
        auVar126 = vunpcklps_avx(auVar98,auVar110);
        auVar98 = vunpckhps_avx(auVar98,auVar110);
        auVar34 = vunpcklps_avx(auVar158,auVar98);
        auVar170 = vunpcklps_avx(auVar169,auVar126);
        auVar158 = vunpckhps_avx(auVar169,auVar126);
        auVar98 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
        auVar110 = vshufps_avx(ZEXT416((uint)(1.0 - fVar108)),ZEXT416((uint)(1.0 - fVar108)),0);
        fVar108 = auVar98._0_4_;
        fVar118 = auVar98._4_4_;
        fVar3 = auVar98._8_4_;
        fVar22 = auVar98._12_4_;
        fVar107 = auVar110._0_4_;
        fVar117 = auVar110._4_4_;
        fVar119 = auVar110._8_4_;
        fVar132 = auVar110._12_4_;
        auVar113._4_4_ = fVar117 * (float)local_1310._4_4_ + auVar167._4_4_ * fVar118;
        auVar113._0_4_ = fVar107 * (float)local_1310._0_4_ + auVar167._0_4_ * fVar108;
        auVar113._8_4_ = fVar119 * fStack_1308 + auVar167._8_4_ * fVar3;
        auVar113._12_4_ = fVar132 * fStack_1304 + auVar167._12_4_ * fVar22;
        local_1560._0_4_ = auVar143._0_4_;
        local_1560._4_4_ = auVar143._4_4_;
        fStack_1558 = auVar143._8_4_;
        fStack_1554 = auVar143._12_4_;
        auVar148._4_4_ = fVar117 * (float)local_1560._4_4_ + fVar118 * auVar142._4_4_;
        auVar148._0_4_ = fVar107 * (float)local_1560._0_4_ + fVar108 * auVar142._0_4_;
        auVar148._8_4_ = fVar119 * fStack_1558 + fVar3 * auVar142._8_4_;
        auVar148._12_4_ = fVar132 * fStack_1554 + fVar22 * auVar142._12_4_;
        local_1500._0_4_ = auVar168._0_4_;
        local_1500._4_4_ = auVar168._4_4_;
        fStack_14f8 = auVar168._8_4_;
        fStack_14f4 = auVar168._12_4_;
        auVar173._4_4_ = fVar117 * (float)local_1500._4_4_ + auVar160._4_4_ * fVar118;
        auVar173._0_4_ = fVar107 * (float)local_1500._0_4_ + auVar160._0_4_ * fVar108;
        auVar173._8_4_ = fVar119 * fStack_14f8 + auVar160._8_4_ * fVar3;
        auVar173._12_4_ = fVar132 * fStack_14f4 + auVar160._12_4_ * fVar22;
        local_1580._0_4_ = auVar111._0_4_;
        local_1580._4_4_ = auVar111._4_4_;
        fStack_1578 = auVar111._8_4_;
        fStack_1574 = auVar111._12_4_;
        auVar177._0_4_ = fVar107 * (float)local_1580._0_4_ + fVar108 * auVar146._0_4_;
        auVar177._4_4_ = fVar117 * (float)local_1580._4_4_ + fVar118 * auVar146._4_4_;
        auVar177._8_4_ = fVar119 * fStack_1578 + fVar3 * auVar146._8_4_;
        auVar177._12_4_ = fVar132 * fStack_1574 + fVar22 * auVar146._12_4_;
        local_1540._0_4_ = auVar144._0_4_;
        local_1540._4_4_ = auVar144._4_4_;
        fStack_1538 = auVar144._8_4_;
        fStack_1534 = auVar144._12_4_;
        auVar126._0_4_ = fVar107 * (float)local_1540._0_4_ + auVar109._0_4_ * fVar108;
        auVar126._4_4_ = fVar117 * (float)local_1540._4_4_ + auVar109._4_4_ * fVar118;
        auVar126._8_4_ = fVar119 * fStack_1538 + auVar109._8_4_ * fVar3;
        auVar126._12_4_ = fVar132 * fStack_1534 + auVar109._12_4_ * fVar22;
        local_14e0._0_4_ = auVar159._0_4_;
        local_14e0._4_4_ = auVar159._4_4_;
        fStack_14d8 = auVar159._8_4_;
        fStack_14d4 = auVar159._12_4_;
        auVar244._0_4_ = fVar107 * (float)local_14e0._0_4_ + auVar125._0_4_ * fVar108;
        auVar244._4_4_ = fVar117 * (float)local_14e0._4_4_ + auVar125._4_4_ * fVar118;
        auVar244._8_4_ = fVar119 * fStack_14d8 + auVar125._8_4_ * fVar3;
        auVar244._12_4_ = fVar132 * fStack_14d4 + auVar125._12_4_ * fVar22;
        auVar113._20_4_ = fVar117 * (float)local_1360._4_4_ + fVar118 * auVar162._4_4_;
        auVar113._16_4_ = fVar107 * (float)local_1360._0_4_ + fVar108 * auVar162._0_4_;
        auVar113._24_4_ = fVar119 * fStack_1358 + fVar3 * auVar162._8_4_;
        auVar113._28_4_ = fVar132 * fStack_1354 + fVar22 * auVar162._12_4_;
        auVar148._20_4_ = fVar117 * (float)local_1350._4_4_ + auVar145._4_4_ * fVar118;
        auVar148._16_4_ = fVar107 * (float)local_1350._0_4_ + auVar145._0_4_ * fVar108;
        auVar148._24_4_ = fVar119 * fStack_1348 + auVar145._8_4_ * fVar3;
        auVar148._28_4_ = fVar132 * fStack_1344 + auVar145._12_4_ * fVar22;
        auVar173._20_4_ = fVar117 * (float)local_1320._4_4_ + auVar99._4_4_ * fVar118;
        auVar173._16_4_ = fVar107 * (float)local_1320._0_4_ + auVar99._0_4_ * fVar108;
        auVar173._24_4_ = fVar119 * fStack_1318 + auVar99._8_4_ * fVar3;
        auVar173._28_4_ = fVar132 * fStack_1314 + auVar99._12_4_ * fVar22;
        lVar8 = uVar94 + 0x40 + lVar70;
        local_10e0 = *(undefined8 *)(lVar8 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar8 + 0x18);
        auVar162._0_4_ = auVar161._0_4_ * fVar107 + fVar108 * auVar170._0_4_;
        auVar162._4_4_ = auVar161._4_4_ * fVar117 + fVar118 * auVar170._4_4_;
        auVar162._8_4_ = auVar161._8_4_ * fVar119 + fVar3 * auVar170._8_4_;
        auVar162._12_4_ = auVar161._12_4_ * fVar132 + fVar22 * auVar170._12_4_;
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar70 = uVar94 + 0x50 + lVar70;
        local_1300 = *(undefined8 *)(lVar70 + 0x10);
        uStack_12f8 = *(undefined8 *)(lVar70 + 0x18);
        auVar170._0_4_ = fVar107 * (float)local_1340._0_4_ + fVar108 * auVar158._0_4_;
        auVar170._4_4_ = fVar117 * (float)local_1340._4_4_ + fVar118 * auVar158._4_4_;
        auVar170._8_4_ = fVar119 * fStack_1338 + fVar3 * auVar158._8_4_;
        auVar170._12_4_ = fVar132 * fStack_1334 + fVar22 * auVar158._12_4_;
        auVar99._0_4_ = fVar107 * (float)local_1330._0_4_ + fVar108 * auVar34._0_4_;
        auVar99._4_4_ = fVar117 * (float)local_1330._4_4_ + fVar118 * auVar34._4_4_;
        auVar99._8_4_ = fVar119 * fStack_1328 + fVar3 * auVar34._8_4_;
        auVar99._12_4_ = fVar132 * fStack_1324 + fVar22 * auVar34._12_4_;
        uStack_12f0 = local_1300;
        uStack_12e8 = uStack_12f8;
        auVar178._16_16_ = auVar177;
        auVar178._0_16_ = auVar177;
        auVar127._16_16_ = auVar126;
        auVar127._0_16_ = auVar126;
        auVar182._16_16_ = auVar244;
        auVar182._0_16_ = auVar244;
        auVar198._16_16_ = auVar162;
        auVar198._0_16_ = auVar162;
        auVar171._16_16_ = auVar170;
        auVar171._0_16_ = auVar170;
        auVar208._16_16_ = auVar99;
        auVar208._0_16_ = auVar99;
        uVar67 = *(undefined4 *)(ray + k * 4);
        auVar211._4_4_ = uVar67;
        auVar211._0_4_ = uVar67;
        auVar211._8_4_ = uVar67;
        auVar211._12_4_ = uVar67;
        auVar211._16_4_ = uVar67;
        auVar211._20_4_ = uVar67;
        auVar211._24_4_ = uVar67;
        auVar211._28_4_ = uVar67;
        uVar67 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar221._4_4_ = uVar67;
        auVar221._0_4_ = uVar67;
        auVar221._8_4_ = uVar67;
        auVar221._12_4_ = uVar67;
        auVar221._16_4_ = uVar67;
        auVar221._20_4_ = uVar67;
        auVar221._24_4_ = uVar67;
        auVar221._28_4_ = uVar67;
        uVar67 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar245._4_4_ = uVar67;
        auVar245._0_4_ = uVar67;
        auVar245._8_4_ = uVar67;
        auVar245._12_4_ = uVar67;
        auVar245._16_4_ = uVar67;
        auVar245._20_4_ = uVar67;
        auVar245._24_4_ = uVar67;
        auVar245._28_4_ = uVar67;
        local_1440 = vsubps_avx(auVar113,auVar211);
        local_1460 = vsubps_avx(auVar148,auVar221);
        local_1480 = vsubps_avx(auVar173,auVar245);
        auVar112 = vsubps_avx(auVar178,auVar211);
        auVar147 = vsubps_avx(auVar127,auVar221);
        auVar27 = vsubps_avx(auVar182,auVar245);
        auVar28 = vsubps_avx(auVar198,auVar211);
        auVar29 = vsubps_avx(auVar171,auVar221);
        auVar30 = vsubps_avx(auVar208,auVar245);
        local_14a0 = vsubps_avx(auVar28,local_1440);
        local_14c0 = vsubps_avx(auVar29,local_1460);
        _local_14e0 = vsubps_avx(auVar30,local_1480);
        fVar3 = local_1460._0_4_;
        fVar108 = auVar29._0_4_ + fVar3;
        fVar117 = local_1460._4_4_;
        fVar118 = auVar29._4_4_ + fVar117;
        fVar133 = local_1460._8_4_;
        fVar120 = auVar29._8_4_ + fVar133;
        fVar138 = local_1460._12_4_;
        fVar121 = auVar29._12_4_ + fVar138;
        fVar13 = local_1460._16_4_;
        fVar122 = auVar29._16_4_ + fVar13;
        fVar16 = local_1460._20_4_;
        fVar123 = auVar29._20_4_ + fVar16;
        fVar19 = local_1460._24_4_;
        fVar124 = auVar29._24_4_ + fVar19;
        fVar22 = local_1480._0_4_;
        fVar180 = auVar30._0_4_ + fVar22;
        fVar119 = local_1480._4_4_;
        fVar184 = auVar30._4_4_ + fVar119;
        fVar134 = local_1480._8_4_;
        fVar186 = auVar30._8_4_ + fVar134;
        fVar140 = local_1480._12_4_;
        fVar188 = auVar30._12_4_ + fVar140;
        fVar14 = local_1480._16_4_;
        fVar190 = auVar30._16_4_ + fVar14;
        fVar17 = local_1480._20_4_;
        fVar192 = auVar30._20_4_ + fVar17;
        fVar20 = local_1480._24_4_;
        fVar194 = auVar30._24_4_ + fVar20;
        fVar197 = local_1480._28_4_;
        fVar23 = local_14e0._0_4_;
        fVar24 = local_14e0._4_4_;
        auVar31._4_4_ = fVar118 * fVar24;
        auVar31._0_4_ = fVar108 * fVar23;
        fVar25 = local_14e0._8_4_;
        auVar31._8_4_ = fVar120 * fVar25;
        fVar26 = local_14e0._12_4_;
        auVar31._12_4_ = fVar121 * fVar26;
        fVar97 = local_14e0._16_4_;
        auVar31._16_4_ = fVar122 * fVar97;
        fVar105 = local_14e0._20_4_;
        auVar31._20_4_ = fVar123 * fVar105;
        fVar106 = local_14e0._24_4_;
        auVar31._24_4_ = fVar124 * fVar106;
        auVar31._28_4_ = auVar162._12_4_;
        fVar219 = local_14c0._0_4_;
        fVar223 = local_14c0._4_4_;
        auVar32._4_4_ = fVar223 * fVar184;
        auVar32._0_4_ = fVar219 * fVar180;
        fVar225 = local_14c0._8_4_;
        auVar32._8_4_ = fVar225 * fVar186;
        fVar227 = local_14c0._12_4_;
        auVar32._12_4_ = fVar227 * fVar188;
        fVar229 = local_14c0._16_4_;
        auVar32._16_4_ = fVar229 * fVar190;
        fVar231 = local_14c0._20_4_;
        auVar32._20_4_ = fVar231 * fVar192;
        fVar233 = local_14c0._24_4_;
        auVar32._24_4_ = fVar233 * fVar194;
        auVar32._28_4_ = auVar99._12_4_;
        auVar31 = vsubps_avx(auVar32,auVar31);
        fVar107 = local_1440._0_4_;
        fVar196 = auVar28._0_4_ + fVar107;
        fVar132 = local_1440._4_4_;
        fVar202 = auVar28._4_4_ + fVar132;
        fVar136 = local_1440._8_4_;
        fVar203 = auVar28._8_4_ + fVar136;
        fVar12 = local_1440._12_4_;
        fVar204 = auVar28._12_4_ + fVar12;
        fVar15 = local_1440._16_4_;
        fVar205 = auVar28._16_4_ + fVar15;
        fVar18 = local_1440._20_4_;
        fVar206 = auVar28._20_4_ + fVar18;
        fVar21 = local_1440._24_4_;
        fVar207 = auVar28._24_4_ + fVar21;
        fVar210 = local_14a0._0_4_;
        fVar213 = local_14a0._4_4_;
        auVar33._4_4_ = fVar213 * fVar184;
        auVar33._0_4_ = fVar210 * fVar180;
        fVar214 = local_14a0._8_4_;
        auVar33._8_4_ = fVar214 * fVar186;
        fVar215 = local_14a0._12_4_;
        auVar33._12_4_ = fVar215 * fVar188;
        fVar216 = local_14a0._16_4_;
        auVar33._16_4_ = fVar216 * fVar190;
        fVar217 = local_14a0._20_4_;
        auVar33._20_4_ = fVar217 * fVar192;
        fVar218 = local_14a0._24_4_;
        auVar33._24_4_ = fVar218 * fVar194;
        auVar33._28_4_ = auVar30._28_4_ + fVar197;
        auVar35._4_4_ = fVar202 * fVar24;
        auVar35._0_4_ = fVar196 * fVar23;
        auVar35._8_4_ = fVar203 * fVar25;
        auVar35._12_4_ = fVar204 * fVar26;
        auVar35._16_4_ = fVar205 * fVar97;
        auVar35._20_4_ = fVar206 * fVar105;
        auVar35._24_4_ = fVar207 * fVar106;
        auVar35._28_4_ = auVar99._12_4_;
        auVar32 = vsubps_avx(auVar35,auVar33);
        auVar36._4_4_ = fVar202 * fVar223;
        auVar36._0_4_ = fVar196 * fVar219;
        auVar36._8_4_ = fVar203 * fVar225;
        auVar36._12_4_ = fVar204 * fVar227;
        auVar36._16_4_ = fVar205 * fVar229;
        auVar36._20_4_ = fVar206 * fVar231;
        auVar36._24_4_ = fVar207 * fVar233;
        auVar36._28_4_ = auVar28._28_4_ + local_1440._28_4_;
        auVar37._4_4_ = fVar213 * fVar118;
        auVar37._0_4_ = fVar210 * fVar108;
        auVar37._8_4_ = fVar214 * fVar120;
        auVar37._12_4_ = fVar215 * fVar121;
        auVar37._16_4_ = fVar216 * fVar122;
        auVar37._20_4_ = fVar217 * fVar123;
        auVar37._24_4_ = fVar218 * fVar124;
        auVar37._28_4_ = auVar29._28_4_ + local_1460._28_4_;
        auVar33 = vsubps_avx(auVar37,auVar36);
        fVar108 = *(float *)(ray + k * 4 + 0xa0);
        fVar118 = *(float *)(ray + k * 4 + 0xc0);
        fStack_1418 = *(float *)(ray + k * 4 + 0x80);
        _local_1420 = CONCAT44(fStack_1418,fStack_1418);
        local_1520._0_4_ =
             auVar31._0_4_ * fStack_1418 + fVar108 * auVar32._0_4_ + auVar33._0_4_ * fVar118;
        local_1520._4_4_ =
             auVar31._4_4_ * fStack_1418 + fVar108 * auVar32._4_4_ + auVar33._4_4_ * fVar118;
        local_1520._8_4_ =
             auVar31._8_4_ * fStack_1418 + fVar108 * auVar32._8_4_ + auVar33._8_4_ * fVar118;
        local_1520._12_4_ =
             auVar31._12_4_ * fStack_1418 + fVar108 * auVar32._12_4_ + auVar33._12_4_ * fVar118;
        local_1520._16_4_ =
             auVar31._16_4_ * fStack_1418 + fVar108 * auVar32._16_4_ + auVar33._16_4_ * fVar118;
        local_1520._20_4_ =
             auVar31._20_4_ * fStack_1418 + fVar108 * auVar32._20_4_ + auVar33._20_4_ * fVar118;
        local_1520._24_4_ =
             auVar31._24_4_ * fStack_1418 + fVar108 * auVar32._24_4_ + auVar33._24_4_ * fVar118;
        local_1520._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar33._28_4_;
        _local_1500 = vsubps_avx(local_1460,auVar147);
        auVar32 = vsubps_avx(local_1480,auVar27);
        fVar122 = fVar3 + auVar147._0_4_;
        fVar123 = fVar117 + auVar147._4_4_;
        fVar124 = fVar133 + auVar147._8_4_;
        fVar180 = fVar138 + auVar147._12_4_;
        fVar184 = fVar13 + auVar147._16_4_;
        fVar186 = fVar16 + auVar147._20_4_;
        fVar188 = fVar19 + auVar147._24_4_;
        fVar120 = auVar147._28_4_;
        fVar190 = fVar22 + auVar27._0_4_;
        fVar192 = fVar119 + auVar27._4_4_;
        fVar194 = fVar134 + auVar27._8_4_;
        fVar196 = fVar140 + auVar27._12_4_;
        fVar202 = fVar14 + auVar27._16_4_;
        fVar203 = fVar17 + auVar27._20_4_;
        fVar204 = fVar20 + auVar27._24_4_;
        fVar121 = auVar27._28_4_;
        fVar236 = auVar32._0_4_;
        fVar238 = auVar32._4_4_;
        auVar38._4_4_ = fVar238 * fVar123;
        auVar38._0_4_ = fVar236 * fVar122;
        fVar239 = auVar32._8_4_;
        auVar38._8_4_ = fVar239 * fVar124;
        fVar240 = auVar32._12_4_;
        auVar38._12_4_ = fVar240 * fVar180;
        fVar241 = auVar32._16_4_;
        auVar38._16_4_ = fVar241 * fVar184;
        fVar242 = auVar32._20_4_;
        auVar38._20_4_ = fVar242 * fVar186;
        fVar243 = auVar32._24_4_;
        auVar38._24_4_ = fVar243 * fVar188;
        auVar38._28_4_ = auVar31._28_4_;
        fVar181 = local_1500._0_4_;
        fVar185 = local_1500._4_4_;
        auVar39._4_4_ = fVar185 * fVar192;
        auVar39._0_4_ = fVar181 * fVar190;
        fVar187 = local_1500._8_4_;
        auVar39._8_4_ = fVar187 * fVar194;
        fVar189 = local_1500._12_4_;
        auVar39._12_4_ = fVar189 * fVar196;
        fVar191 = local_1500._16_4_;
        auVar39._16_4_ = fVar191 * fVar202;
        fVar193 = local_1500._20_4_;
        auVar39._20_4_ = fVar193 * fVar203;
        fVar195 = local_1500._24_4_;
        auVar39._24_4_ = fVar195 * fVar204;
        auVar39._28_4_ = fVar197;
        auVar31 = vsubps_avx(auVar39,auVar38);
        auVar32 = vsubps_avx(local_1440,auVar112);
        fVar247 = auVar32._0_4_;
        fVar249 = auVar32._4_4_;
        auVar40._4_4_ = fVar249 * fVar192;
        auVar40._0_4_ = fVar247 * fVar190;
        fVar250 = auVar32._8_4_;
        auVar40._8_4_ = fVar250 * fVar194;
        fVar251 = auVar32._12_4_;
        auVar40._12_4_ = fVar251 * fVar196;
        fVar252 = auVar32._16_4_;
        auVar40._16_4_ = fVar252 * fVar202;
        fVar253 = auVar32._20_4_;
        auVar40._20_4_ = fVar253 * fVar203;
        fVar254 = auVar32._24_4_;
        auVar40._24_4_ = fVar254 * fVar204;
        auVar40._28_4_ = fVar197 + fVar121;
        fVar197 = auVar112._0_4_ + fVar107;
        fVar190 = auVar112._4_4_ + fVar132;
        fVar192 = auVar112._8_4_ + fVar136;
        fVar194 = auVar112._12_4_ + fVar12;
        fVar196 = auVar112._16_4_ + fVar15;
        fVar202 = auVar112._20_4_ + fVar18;
        fVar203 = auVar112._24_4_ + fVar21;
        fVar235 = auVar112._28_4_;
        auVar41._4_4_ = fVar190 * fVar238;
        auVar41._0_4_ = fVar197 * fVar236;
        auVar41._8_4_ = fVar192 * fVar239;
        auVar41._12_4_ = fVar194 * fVar240;
        auVar41._16_4_ = fVar196 * fVar241;
        auVar41._20_4_ = fVar202 * fVar242;
        auVar41._24_4_ = fVar203 * fVar243;
        auVar41._28_4_ = fVar235;
        auVar32 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = fVar190 * fVar185;
        auVar42._0_4_ = fVar197 * fVar181;
        auVar42._8_4_ = fVar192 * fVar187;
        auVar42._12_4_ = fVar194 * fVar189;
        auVar42._16_4_ = fVar196 * fVar191;
        auVar42._20_4_ = fVar202 * fVar193;
        auVar42._24_4_ = fVar203 * fVar195;
        auVar42._28_4_ = fVar235 + local_1440._28_4_;
        auVar43._4_4_ = fVar249 * fVar123;
        auVar43._0_4_ = fVar247 * fVar122;
        auVar43._8_4_ = fVar250 * fVar124;
        auVar43._12_4_ = fVar251 * fVar180;
        auVar43._16_4_ = fVar252 * fVar184;
        auVar43._20_4_ = fVar253 * fVar186;
        auVar43._24_4_ = fVar254 * fVar188;
        auVar43._28_4_ = local_1460._28_4_ + fVar120;
        auVar33 = vsubps_avx(auVar43,auVar42);
        local_1540._0_4_ =
             fStack_1418 * auVar31._0_4_ + auVar33._0_4_ * fVar118 + fVar108 * auVar32._0_4_;
        local_1540._4_4_ =
             fStack_1418 * auVar31._4_4_ + auVar33._4_4_ * fVar118 + fVar108 * auVar32._4_4_;
        fStack_1538 = fStack_1418 * auVar31._8_4_ +
                      auVar33._8_4_ * fVar118 + fVar108 * auVar32._8_4_;
        fStack_1534 = fStack_1418 * auVar31._12_4_ +
                      auVar33._12_4_ * fVar118 + fVar108 * auVar32._12_4_;
        register0x00001450 =
             fStack_1418 * auVar31._16_4_ + auVar33._16_4_ * fVar118 + fVar108 * auVar32._16_4_;
        register0x00001454 =
             fStack_1418 * auVar31._20_4_ + auVar33._20_4_ * fVar118 + fVar108 * auVar32._20_4_;
        register0x00001458 =
             fStack_1418 * auVar31._24_4_ + auVar33._24_4_ * fVar118 + fVar108 * auVar32._24_4_;
        register0x0000145c = auVar32._28_4_ + auVar33._28_4_ + auVar32._28_4_;
        auVar31 = vsubps_avx(auVar112,auVar28);
        fVar204 = auVar112._0_4_ + auVar28._0_4_;
        fVar205 = auVar112._4_4_ + auVar28._4_4_;
        fVar206 = auVar112._8_4_ + auVar28._8_4_;
        fVar207 = auVar112._12_4_ + auVar28._12_4_;
        fVar135 = auVar112._16_4_ + auVar28._16_4_;
        fVar137 = auVar112._20_4_ + auVar28._20_4_;
        fVar139 = auVar112._24_4_ + auVar28._24_4_;
        auVar32 = vsubps_avx(auVar147,auVar29);
        fVar141 = auVar147._0_4_ + auVar29._0_4_;
        fVar151 = auVar147._4_4_ + auVar29._4_4_;
        fVar152 = auVar147._8_4_ + auVar29._8_4_;
        fVar153 = auVar147._12_4_ + auVar29._12_4_;
        fVar154 = auVar147._16_4_ + auVar29._16_4_;
        fVar155 = auVar147._20_4_ + auVar29._20_4_;
        fVar156 = auVar147._24_4_ + auVar29._24_4_;
        fVar157 = fVar120 + auVar29._28_4_;
        auVar112 = vsubps_avx(auVar27,auVar30);
        fVar192 = auVar30._0_4_ + auVar27._0_4_;
        fVar194 = auVar30._4_4_ + auVar27._4_4_;
        fVar196 = auVar30._8_4_ + auVar27._8_4_;
        fVar202 = auVar30._12_4_ + auVar27._12_4_;
        fVar203 = auVar30._16_4_ + auVar27._16_4_;
        fVar165 = auVar30._20_4_ + auVar27._20_4_;
        fVar166 = auVar30._24_4_ + auVar27._24_4_;
        fVar220 = auVar112._0_4_;
        fVar224 = auVar112._4_4_;
        auVar27._4_4_ = fVar224 * fVar151;
        auVar27._0_4_ = fVar220 * fVar141;
        fVar226 = auVar112._8_4_;
        auVar27._8_4_ = fVar226 * fVar152;
        fVar228 = auVar112._12_4_;
        auVar27._12_4_ = fVar228 * fVar153;
        fVar230 = auVar112._16_4_;
        auVar27._16_4_ = fVar230 * fVar154;
        fVar232 = auVar112._20_4_;
        auVar27._20_4_ = fVar232 * fVar155;
        fVar234 = auVar112._24_4_;
        auVar27._24_4_ = fVar234 * fVar156;
        auVar27._28_4_ = fVar121;
        fVar197 = auVar32._0_4_;
        fVar122 = auVar32._4_4_;
        auVar29._4_4_ = fVar122 * fVar194;
        auVar29._0_4_ = fVar197 * fVar192;
        fVar123 = auVar32._8_4_;
        auVar29._8_4_ = fVar123 * fVar196;
        fVar124 = auVar32._12_4_;
        auVar29._12_4_ = fVar124 * fVar202;
        fVar180 = auVar32._16_4_;
        auVar29._16_4_ = fVar180 * fVar203;
        fVar184 = auVar32._20_4_;
        auVar29._20_4_ = fVar184 * fVar165;
        fVar186 = auVar32._24_4_;
        auVar29._24_4_ = fVar186 * fVar166;
        auVar29._28_4_ = fVar120;
        auVar112 = vsubps_avx(auVar29,auVar27);
        fVar188 = auVar31._0_4_;
        fVar190 = auVar31._4_4_;
        auVar44._4_4_ = fVar190 * fVar194;
        auVar44._0_4_ = fVar188 * fVar192;
        fVar192 = auVar31._8_4_;
        auVar44._8_4_ = fVar192 * fVar196;
        fVar194 = auVar31._12_4_;
        auVar44._12_4_ = fVar194 * fVar202;
        fVar196 = auVar31._16_4_;
        auVar44._16_4_ = fVar196 * fVar203;
        fVar202 = auVar31._20_4_;
        auVar44._20_4_ = fVar202 * fVar165;
        fVar203 = auVar31._24_4_;
        auVar44._24_4_ = fVar203 * fVar166;
        auVar44._28_4_ = auVar30._28_4_ + fVar121;
        auVar30._4_4_ = fVar224 * fVar205;
        auVar30._0_4_ = fVar220 * fVar204;
        auVar30._8_4_ = fVar226 * fVar206;
        auVar30._12_4_ = fVar228 * fVar207;
        auVar30._16_4_ = fVar230 * fVar135;
        auVar30._20_4_ = fVar232 * fVar137;
        auVar30._24_4_ = fVar234 * fVar139;
        auVar30._28_4_ = fVar120;
        auVar147 = vsubps_avx(auVar30,auVar44);
        auVar45._4_4_ = fVar205 * fVar122;
        auVar45._0_4_ = fVar204 * fVar197;
        auVar45._8_4_ = fVar206 * fVar123;
        auVar45._12_4_ = fVar207 * fVar124;
        auVar45._16_4_ = fVar135 * fVar180;
        auVar45._20_4_ = fVar137 * fVar184;
        auVar45._24_4_ = fVar139 * fVar186;
        auVar45._28_4_ = fVar235 + auVar28._28_4_;
        auVar28._4_4_ = fVar190 * fVar151;
        auVar28._0_4_ = fVar188 * fVar141;
        auVar28._8_4_ = fVar192 * fVar152;
        auVar28._12_4_ = fVar194 * fVar153;
        auVar28._16_4_ = fVar196 * fVar154;
        auVar28._20_4_ = fVar202 * fVar155;
        auVar28._24_4_ = fVar203 * fVar156;
        auVar28._28_4_ = fVar157;
        auVar27 = vsubps_avx(auVar28,auVar45);
        auVar128._0_4_ =
             fStack_1418 * auVar112._0_4_ + auVar27._0_4_ * fVar118 + fVar108 * auVar147._0_4_;
        auVar128._4_4_ =
             fStack_1418 * auVar112._4_4_ + auVar27._4_4_ * fVar118 + fVar108 * auVar147._4_4_;
        auVar128._8_4_ =
             fStack_1418 * auVar112._8_4_ + auVar27._8_4_ * fVar118 + fVar108 * auVar147._8_4_;
        auVar128._12_4_ =
             fStack_1418 * auVar112._12_4_ + auVar27._12_4_ * fVar118 + fVar108 * auVar147._12_4_;
        auVar128._16_4_ =
             fStack_1418 * auVar112._16_4_ + auVar27._16_4_ * fVar118 + fVar108 * auVar147._16_4_;
        auVar128._20_4_ =
             fStack_1418 * auVar112._20_4_ + auVar27._20_4_ * fVar118 + fVar108 * auVar147._20_4_;
        auVar128._24_4_ =
             fStack_1418 * auVar112._24_4_ + auVar27._24_4_ * fVar118 + fVar108 * auVar147._24_4_;
        auVar128._28_4_ = fVar157 + auVar27._28_4_ + fVar157;
        local_1560._0_4_ = auVar128._0_4_ + local_1520._0_4_ + (float)local_1540._0_4_;
        local_1560._4_4_ = auVar128._4_4_ + local_1520._4_4_ + (float)local_1540._4_4_;
        fStack_1558 = auVar128._8_4_ + local_1520._8_4_ + fStack_1538;
        fStack_1554 = auVar128._12_4_ + local_1520._12_4_ + fStack_1534;
        register0x00001350 = auVar128._16_4_ + local_1520._16_4_ + register0x00001450;
        register0x00001354 = auVar128._20_4_ + local_1520._20_4_ + register0x00001454;
        register0x00001358 = auVar128._24_4_ + local_1520._24_4_ + register0x00001458;
        register0x0000135c = auVar128._28_4_ + local_1520._28_4_ + register0x0000145c;
        auVar112 = vminps_avx(local_1520,_local_1540);
        auVar112 = vminps_avx(auVar112,auVar128);
        auVar163._8_4_ = 0x7fffffff;
        auVar163._0_8_ = 0x7fffffff7fffffff;
        auVar163._12_4_ = 0x7fffffff;
        auVar163._16_4_ = 0x7fffffff;
        auVar163._20_4_ = 0x7fffffff;
        auVar163._24_4_ = 0x7fffffff;
        auVar163._28_4_ = 0x7fffffff;
        _local_1580 = vandps_avx(_local_1560,auVar163);
        fVar121 = local_1580._0_4_ * 1.1920929e-07;
        fVar204 = local_1580._4_4_ * 1.1920929e-07;
        auVar46._4_4_ = fVar204;
        auVar46._0_4_ = fVar121;
        fVar205 = local_1580._8_4_ * 1.1920929e-07;
        auVar46._8_4_ = fVar205;
        fVar206 = local_1580._12_4_ * 1.1920929e-07;
        auVar46._12_4_ = fVar206;
        fVar207 = local_1580._16_4_ * 1.1920929e-07;
        auVar46._16_4_ = fVar207;
        fVar135 = local_1580._20_4_ * 1.1920929e-07;
        auVar46._20_4_ = fVar135;
        fVar137 = local_1580._24_4_ * 1.1920929e-07;
        auVar46._24_4_ = fVar137;
        auVar46._28_4_ = 0x34000000;
        auVar172._0_8_ = CONCAT44(fVar204,fVar121) ^ 0x8000000080000000;
        auVar172._8_4_ = -fVar205;
        auVar172._12_4_ = -fVar206;
        auVar172._16_4_ = -fVar207;
        auVar172._20_4_ = -fVar135;
        auVar172._24_4_ = -fVar137;
        auVar172._28_4_ = 0xb4000000;
        auVar112 = vcmpps_avx(auVar112,auVar172,5);
        auVar27 = vmaxps_avx(local_1520,_local_1540);
        auVar147 = vmaxps_avx(auVar27,auVar128);
        auVar147 = vcmpps_avx(auVar147,auVar46,2);
        auVar147 = vorps_avx(auVar112,auVar147);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0x7f,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0xbf,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar147[0x1f] < '\0') {
          auVar47._4_4_ = fVar185 * fVar24;
          auVar47._0_4_ = fVar181 * fVar23;
          auVar47._8_4_ = fVar187 * fVar25;
          auVar47._12_4_ = fVar189 * fVar26;
          auVar47._16_4_ = fVar191 * fVar97;
          auVar47._20_4_ = fVar193 * fVar105;
          auVar47._24_4_ = fVar195 * fVar106;
          auVar47._28_4_ = auVar112._28_4_;
          auVar48._4_4_ = fVar223 * fVar238;
          auVar48._0_4_ = fVar219 * fVar236;
          auVar48._8_4_ = fVar225 * fVar239;
          auVar48._12_4_ = fVar227 * fVar240;
          auVar48._16_4_ = fVar229 * fVar241;
          auVar48._20_4_ = fVar231 * fVar242;
          auVar48._24_4_ = fVar233 * fVar243;
          auVar48._28_4_ = 0x34000000;
          auVar28 = vsubps_avx(auVar48,auVar47);
          auVar49._4_4_ = fVar238 * fVar122;
          auVar49._0_4_ = fVar236 * fVar197;
          auVar49._8_4_ = fVar239 * fVar123;
          auVar49._12_4_ = fVar240 * fVar124;
          auVar49._16_4_ = fVar241 * fVar180;
          auVar49._20_4_ = fVar242 * fVar184;
          auVar49._24_4_ = fVar243 * fVar186;
          auVar49._28_4_ = auVar27._28_4_;
          auVar50._4_4_ = fVar185 * fVar224;
          auVar50._0_4_ = fVar181 * fVar220;
          auVar50._8_4_ = fVar187 * fVar226;
          auVar50._12_4_ = fVar189 * fVar228;
          auVar50._16_4_ = fVar191 * fVar230;
          auVar50._20_4_ = fVar193 * fVar232;
          auVar50._24_4_ = fVar195 * fVar234;
          auVar50._28_4_ = fVar120;
          auVar29 = vsubps_avx(auVar50,auVar49);
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar199._16_4_ = 0x7fffffff;
          auVar199._20_4_ = 0x7fffffff;
          auVar199._24_4_ = 0x7fffffff;
          auVar199._28_4_ = 0x7fffffff;
          auVar112 = vandps_avx(auVar199,auVar47);
          auVar27 = vandps_avx(auVar199,auVar49);
          auVar112 = vcmpps_avx(auVar112,auVar27,1);
          local_1280 = vblendvps_avx(auVar29,auVar28,auVar112);
          auVar51._4_4_ = fVar249 * fVar224;
          auVar51._0_4_ = fVar247 * fVar220;
          auVar51._8_4_ = fVar250 * fVar226;
          auVar51._12_4_ = fVar251 * fVar228;
          auVar51._16_4_ = fVar252 * fVar230;
          auVar51._20_4_ = fVar253 * fVar232;
          auVar51._24_4_ = fVar254 * fVar234;
          auVar51._28_4_ = auVar112._28_4_;
          auVar52._4_4_ = fVar249 * fVar24;
          auVar52._0_4_ = fVar247 * fVar23;
          auVar52._8_4_ = fVar250 * fVar25;
          auVar52._12_4_ = fVar251 * fVar26;
          auVar52._16_4_ = fVar252 * fVar97;
          auVar52._20_4_ = fVar253 * fVar105;
          auVar52._24_4_ = fVar254 * fVar106;
          auVar52._28_4_ = auVar28._28_4_;
          auVar53._4_4_ = fVar238 * fVar213;
          auVar53._0_4_ = fVar236 * fVar210;
          auVar53._8_4_ = fVar239 * fVar214;
          auVar53._12_4_ = fVar240 * fVar215;
          auVar53._16_4_ = fVar241 * fVar216;
          auVar53._20_4_ = fVar242 * fVar217;
          auVar53._24_4_ = fVar243 * fVar218;
          auVar53._28_4_ = auVar27._28_4_;
          auVar28 = vsubps_avx(auVar52,auVar53);
          auVar54._4_4_ = fVar238 * fVar190;
          auVar54._0_4_ = fVar236 * fVar188;
          auVar54._8_4_ = fVar239 * fVar192;
          auVar54._12_4_ = fVar240 * fVar194;
          auVar54._16_4_ = fVar241 * fVar196;
          auVar54._20_4_ = fVar242 * fVar202;
          auVar54._24_4_ = fVar243 * fVar203;
          auVar54._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar54,auVar51);
          auVar112 = vandps_avx(auVar199,auVar53);
          auVar27 = vandps_avx(auVar199,auVar51);
          auVar112 = vcmpps_avx(auVar112,auVar27,1);
          local_1260 = vblendvps_avx(auVar29,auVar28,auVar112);
          auVar55._4_4_ = fVar185 * fVar190;
          auVar55._0_4_ = fVar181 * fVar188;
          auVar55._8_4_ = fVar187 * fVar192;
          auVar55._12_4_ = fVar189 * fVar194;
          auVar55._16_4_ = fVar191 * fVar196;
          auVar55._20_4_ = fVar193 * fVar202;
          auVar55._24_4_ = fVar195 * fVar203;
          auVar55._28_4_ = auVar31._28_4_;
          auVar56._4_4_ = fVar185 * fVar213;
          auVar56._0_4_ = fVar181 * fVar210;
          auVar56._8_4_ = fVar187 * fVar214;
          auVar56._12_4_ = fVar189 * fVar215;
          auVar56._16_4_ = fVar191 * fVar216;
          auVar56._20_4_ = fVar193 * fVar217;
          auVar56._24_4_ = fVar195 * fVar218;
          auVar56._28_4_ = auVar112._28_4_;
          auVar57._4_4_ = fVar249 * fVar223;
          auVar57._0_4_ = fVar247 * fVar219;
          auVar57._8_4_ = fVar250 * fVar225;
          auVar57._12_4_ = fVar251 * fVar227;
          auVar57._16_4_ = fVar252 * fVar229;
          auVar57._20_4_ = fVar253 * fVar231;
          auVar57._24_4_ = fVar254 * fVar233;
          auVar57._28_4_ = auVar28._28_4_;
          auVar58._4_4_ = fVar249 * fVar122;
          auVar58._0_4_ = fVar247 * fVar197;
          auVar58._8_4_ = fVar250 * fVar123;
          auVar58._12_4_ = fVar251 * fVar124;
          auVar58._16_4_ = fVar252 * fVar180;
          auVar58._20_4_ = fVar253 * fVar184;
          auVar58._24_4_ = fVar254 * fVar186;
          auVar58._28_4_ = auVar32._28_4_;
          auVar28 = vsubps_avx(auVar56,auVar57);
          auVar29 = vsubps_avx(auVar58,auVar55);
          auVar112 = vandps_avx(auVar199,auVar57);
          auVar27 = vandps_avx(auVar199,auVar55);
          auVar27 = vcmpps_avx(auVar112,auVar27,1);
          local_1240 = vblendvps_avx(auVar29,auVar28,auVar27);
          auVar98 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          fVar180 = local_1240._0_4_;
          fVar184 = local_1240._4_4_;
          fVar186 = local_1240._8_4_;
          fVar188 = local_1240._12_4_;
          fVar190 = local_1240._16_4_;
          fVar192 = local_1240._20_4_;
          fVar194 = local_1240._24_4_;
          fVar196 = local_1260._0_4_;
          fVar202 = local_1260._4_4_;
          fVar203 = local_1260._8_4_;
          fVar204 = local_1260._12_4_;
          fVar205 = local_1260._16_4_;
          fVar206 = local_1260._20_4_;
          fVar207 = local_1260._24_4_;
          fVar197 = local_1280._0_4_;
          fVar120 = local_1280._4_4_;
          fVar121 = local_1280._8_4_;
          fVar23 = local_1280._12_4_;
          fVar24 = local_1280._16_4_;
          fVar25 = local_1280._20_4_;
          fVar26 = local_1280._24_4_;
          fVar97 = fStack_1418 * fVar197 + fVar180 * fVar118 + fVar196 * fVar108;
          fVar105 = fStack_1418 * fVar120 + fVar184 * fVar118 + fVar202 * fVar108;
          fVar106 = fStack_1418 * fVar121 + fVar186 * fVar118 + fVar203 * fVar108;
          fVar122 = fStack_1418 * fVar23 + fVar188 * fVar118 + fVar204 * fVar108;
          fVar123 = fStack_1418 * fVar24 + fVar190 * fVar118 + fVar205 * fVar108;
          fVar124 = fStack_1418 * fVar25 + fVar192 * fVar118 + fVar206 * fVar108;
          fVar108 = fStack_1418 * fVar26 + fVar194 * fVar118 + fVar207 * fVar108;
          fVar118 = auVar147._28_4_ + auVar147._28_4_ + 0.0;
          auVar100._0_4_ = fVar97 + fVar97;
          auVar100._4_4_ = fVar105 + fVar105;
          auVar100._8_4_ = fVar106 + fVar106;
          auVar100._12_4_ = fVar122 + fVar122;
          auVar100._16_4_ = fVar123 + fVar123;
          auVar100._20_4_ = fVar124 + fVar124;
          auVar100._24_4_ = fVar108 + fVar108;
          auVar100._28_4_ = fVar118 + fVar118;
          fVar97 = fVar197 * fVar107 + fVar180 * fVar22 + fVar196 * fVar3;
          fVar132 = fVar120 * fVar132 + fVar184 * fVar119 + fVar202 * fVar117;
          fVar133 = fVar121 * fVar136 + fVar186 * fVar134 + fVar203 * fVar133;
          fVar134 = fVar23 * fVar12 + fVar188 * fVar140 + fVar204 * fVar138;
          fVar136 = fVar24 * fVar15 + fVar190 * fVar14 + fVar205 * fVar13;
          fVar138 = fVar25 * fVar18 + fVar192 * fVar17 + fVar206 * fVar16;
          fVar140 = fVar26 * fVar21 + fVar194 * fVar20 + fVar207 * fVar19;
          auVar147 = vrcpps_avx(auVar100);
          fVar108 = auVar147._0_4_;
          fVar118 = auVar147._4_4_;
          auVar59._4_4_ = auVar100._4_4_ * fVar118;
          auVar59._0_4_ = auVar100._0_4_ * fVar108;
          fVar3 = auVar147._8_4_;
          auVar59._8_4_ = auVar100._8_4_ * fVar3;
          fVar22 = auVar147._12_4_;
          auVar59._12_4_ = auVar100._12_4_ * fVar22;
          fVar107 = auVar147._16_4_;
          auVar59._16_4_ = auVar100._16_4_ * fVar107;
          fVar117 = auVar147._20_4_;
          auVar59._20_4_ = auVar100._20_4_ * fVar117;
          fVar119 = auVar147._24_4_;
          auVar59._24_4_ = auVar100._24_4_ * fVar119;
          auVar59._28_4_ = auVar112._28_4_;
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = &DAT_3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          auVar112 = vsubps_avx(auVar174,auVar59);
          local_11c0._4_4_ = (fVar132 + fVar132) * (fVar118 + fVar118 * auVar112._4_4_);
          local_11c0._0_4_ = (fVar97 + fVar97) * (fVar108 + fVar108 * auVar112._0_4_);
          local_11c0._8_4_ = (fVar133 + fVar133) * (fVar3 + fVar3 * auVar112._8_4_);
          local_11c0._12_4_ = (fVar134 + fVar134) * (fVar22 + fVar22 * auVar112._12_4_);
          local_11c0._16_4_ = (fVar136 + fVar136) * (fVar107 + fVar107 * auVar112._16_4_);
          local_11c0._20_4_ = (fVar138 + fVar138) * (fVar117 + fVar117 * auVar112._20_4_);
          local_11c0._24_4_ = (fVar140 + fVar140) * (fVar119 + fVar119 * auVar112._24_4_);
          local_11c0._28_4_ = local_14c0._28_4_;
          auVar104 = ZEXT3264(local_11c0);
          uVar67 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar129._4_4_ = uVar67;
          auVar129._0_4_ = uVar67;
          auVar129._8_4_ = uVar67;
          auVar129._12_4_ = uVar67;
          auVar129._16_4_ = uVar67;
          auVar129._20_4_ = uVar67;
          auVar129._24_4_ = uVar67;
          auVar129._28_4_ = uVar67;
          auVar112 = vcmpps_avx(auVar129,local_11c0,2);
          uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar149._4_4_ = uVar67;
          auVar149._0_4_ = uVar67;
          auVar149._8_4_ = uVar67;
          auVar149._12_4_ = uVar67;
          auVar149._16_4_ = uVar67;
          auVar149._20_4_ = uVar67;
          auVar149._24_4_ = uVar67;
          auVar149._28_4_ = uVar67;
          auVar147 = vcmpps_avx(local_11c0,auVar149,2);
          auVar112 = vandps_avx(auVar147,auVar112);
          auVar110 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
          auVar98 = vpand_avx(auVar110,auVar98);
          auVar110 = vpmovsxwd_avx(auVar98);
          auVar142 = vpshufd_avx(auVar98,0xee);
          auVar142 = vpmovsxwd_avx(auVar142);
          auVar130._16_16_ = auVar142;
          auVar130._0_16_ = auVar110;
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar130 >> 0x7f,0) != '\0') ||
                (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar142 >> 0x3f,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0xf] < '\0') {
            auVar112 = vcmpps_avx(auVar100,_DAT_02020f00,4);
            auVar110 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            auVar98 = vpand_avx(auVar98,auVar110);
            auVar110 = vpmovsxwd_avx(auVar98);
            auVar142 = vpunpckhwd_avx(auVar98,auVar98);
            local_15c0._16_16_ = auVar142;
            local_15c0._0_16_ = auVar110;
            if ((((((((local_15c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_15c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_15c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_15c0 >> 0x7f,0) != '\0') ||
                  (local_15c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar142 >> 0x3f,0) != '\0') ||
                (local_15c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar142[0xf] < '\0') {
              local_12e0 = local_1520;
              local_12c0 = _local_1540;
              local_12a0 = _local_1560;
              auVar112 = vrcpps_avx(_local_1560);
              fVar108 = auVar112._0_4_;
              fVar118 = auVar112._4_4_;
              auVar60._4_4_ = (float)local_1560._4_4_ * fVar118;
              auVar60._0_4_ = (float)local_1560._0_4_ * fVar108;
              fVar3 = auVar112._8_4_;
              auVar60._8_4_ = fStack_1558 * fVar3;
              fVar22 = auVar112._12_4_;
              auVar60._12_4_ = fStack_1554 * fVar22;
              fVar107 = auVar112._16_4_;
              auVar60._16_4_ = register0x00001350 * fVar107;
              fVar117 = auVar112._20_4_;
              auVar60._20_4_ = register0x00001354 * fVar117;
              fVar119 = auVar112._24_4_;
              auVar60._24_4_ = register0x00001358 * fVar119;
              auVar60._28_4_ = register0x0000135c;
              auVar200._8_4_ = 0x3f800000;
              auVar200._0_8_ = &DAT_3f8000003f800000;
              auVar200._12_4_ = 0x3f800000;
              auVar200._16_4_ = 0x3f800000;
              auVar200._20_4_ = 0x3f800000;
              auVar200._24_4_ = 0x3f800000;
              auVar200._28_4_ = 0x3f800000;
              auVar147 = vsubps_avx(auVar200,auVar60);
              auVar164._0_4_ = fVar108 + fVar108 * auVar147._0_4_;
              auVar164._4_4_ = fVar118 + fVar118 * auVar147._4_4_;
              auVar164._8_4_ = fVar3 + fVar3 * auVar147._8_4_;
              auVar164._12_4_ = fVar22 + fVar22 * auVar147._12_4_;
              auVar164._16_4_ = fVar107 + fVar107 * auVar147._16_4_;
              auVar164._20_4_ = fVar117 + fVar117 * auVar147._20_4_;
              auVar164._24_4_ = fVar119 + fVar119 * auVar147._24_4_;
              auVar164._28_4_ = auVar112._28_4_ + auVar147._28_4_;
              auVar175._8_4_ = 0x219392ef;
              auVar175._0_8_ = 0x219392ef219392ef;
              auVar175._12_4_ = 0x219392ef;
              auVar175._16_4_ = 0x219392ef;
              auVar175._20_4_ = 0x219392ef;
              auVar175._24_4_ = 0x219392ef;
              auVar175._28_4_ = 0x219392ef;
              auVar147 = vcmpps_avx(_local_1580,auVar175,5);
              auVar112 = vandps_avx(auVar147,auVar164);
              local_1220 = local_15c0;
              local_1140 = local_1100;
              auVar61._4_4_ = local_1520._4_4_ * auVar112._4_4_;
              auVar61._0_4_ = local_1520._0_4_ * auVar112._0_4_;
              auVar61._8_4_ = local_1520._8_4_ * auVar112._8_4_;
              auVar61._12_4_ = local_1520._12_4_ * auVar112._12_4_;
              auVar61._16_4_ = local_1520._16_4_ * auVar112._16_4_;
              auVar61._20_4_ = local_1520._20_4_ * auVar112._20_4_;
              auVar61._24_4_ = local_1520._24_4_ * auVar112._24_4_;
              auVar61._28_4_ = auVar147._28_4_;
              auVar147 = vminps_avx(auVar61,auVar200);
              auVar62._4_4_ = (float)local_1540._4_4_ * auVar112._4_4_;
              auVar62._0_4_ = (float)local_1540._0_4_ * auVar112._0_4_;
              auVar62._8_4_ = fStack_1538 * auVar112._8_4_;
              auVar62._12_4_ = fStack_1534 * auVar112._12_4_;
              auVar62._16_4_ = register0x00001450 * auVar112._16_4_;
              auVar62._20_4_ = register0x00001454 * auVar112._20_4_;
              auVar62._24_4_ = register0x00001458 * auVar112._24_4_;
              auVar62._28_4_ = auVar112._28_4_;
              auVar112 = vminps_avx(auVar62,auVar200);
              auVar27 = vsubps_avx(auVar200,auVar147);
              local_11e0 = vblendvps_avx(auVar112,auVar27,local_1100);
              auVar112 = vsubps_avx(auVar200,auVar112);
              local_1200 = vblendvps_avx(auVar147,auVar112,local_1100);
              fVar108 = local_1120._0_4_;
              fVar118 = local_1120._4_4_;
              fVar3 = local_1120._8_4_;
              fVar22 = local_1120._12_4_;
              fVar107 = local_1120._16_4_;
              fVar117 = local_1120._20_4_;
              fVar119 = local_1120._24_4_;
              uStack_1184 = local_1200._28_4_;
              local_11a0[0] = fVar197 * fVar108;
              local_11a0[1] = fVar120 * fVar118;
              local_11a0[2] = fVar121 * fVar3;
              local_11a0[3] = fVar23 * fVar22;
              fStack_1190 = fVar24 * fVar107;
              fStack_118c = fVar25 * fVar117;
              fStack_1188 = fVar26 * fVar119;
              local_1180[0] = fVar196 * fVar108;
              local_1180[1] = fVar202 * fVar118;
              local_1180[2] = fVar203 * fVar3;
              local_1180[3] = fVar204 * fVar22;
              fStack_1170 = fVar205 * fVar107;
              fStack_116c = fVar206 * fVar117;
              fStack_1168 = fVar207 * fVar119;
              uStack_1164 = uStack_1184;
              auVar131._16_16_ = auVar142;
              auVar131._0_16_ = auVar110;
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar150,local_11c0,auVar131);
              local_1160[0] = fVar108 * fVar180;
              local_1160[1] = fVar118 * fVar184;
              local_1160[2] = fVar3 * fVar186;
              local_1160[3] = fVar22 * fVar188;
              fStack_1150 = fVar107 * fVar190;
              fStack_114c = fVar117 * fVar192;
              fStack_1148 = fVar119 * fVar194;
              uStack_1144 = uStack_1184;
              auVar147 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar147 = vminps_avx(auVar112,auVar147);
              auVar27 = vshufpd_avx(auVar147,auVar147,5);
              auVar147 = vminps_avx(auVar147,auVar27);
              auVar27 = vperm2f128_avx(auVar147,auVar147,1);
              auVar147 = vminps_avx(auVar147,auVar27);
              auVar112 = vcmpps_avx(auVar112,auVar147,0);
              auVar110 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
              auVar98 = vpand_avx(auVar110,auVar98);
              auVar110 = vpmovsxwd_avx(auVar98);
              auVar98 = vpunpckhwd_avx(auVar98,auVar98);
              auVar114._16_16_ = auVar98;
              auVar114._0_16_ = auVar110;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar114 >> 0x7f,0) == '\0') &&
                    (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar98 >> 0x3f,0) == '\0') &&
                  (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar98[0xf]) {
                auVar114 = local_15c0;
              }
              uVar68 = vmovmskps_avx(auVar114);
              uVar74 = 0;
              if (uVar68 != 0) {
                for (; (uVar68 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              auVar112 = vcmpps_avx(local_11e0,local_11e0,0xf);
              auVar176 = ZEXT3264(auVar112);
              fStack_1414 = fStack_1418;
              fStack_1410 = fStack_1418;
              fStack_140c = fStack_1418;
              fStack_1408 = fStack_1418;
              fStack_1404 = fStack_1418;
LAB_003ecf7a:
              uVar85 = (ulong)uVar74;
              uVar74 = *(uint *)((long)&local_10e0 + uVar85 * 4);
              pGVar7 = (pSVar5->geometries).items[uVar74].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_15c0 + uVar85 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar67 = *(undefined4 *)(local_1200 + uVar85 * 4);
                  uVar4 = *(undefined4 *)(local_11e0 + uVar85 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar85 - 8];
                  *(float *)(ray + k * 4 + 0x180) = local_11a0[uVar85];
                  *(float *)(ray + k * 4 + 0x1a0) = local_1180[uVar85];
                  *(float *)(ray + k * 4 + 0x1c0) = local_1160[uVar85];
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar67;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1300 + uVar85 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar74;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  goto LAB_003ed3d4;
                }
                local_1060 = *(undefined4 *)(local_1200 + uVar85 * 4);
                local_1040 = *(undefined4 *)(local_11e0 + uVar85 * 4);
                uVar67 = *(undefined4 *)((long)&local_1300 + uVar85 * 4);
                local_1020._4_4_ = uVar67;
                local_1020._0_4_ = uVar67;
                local_1020._8_4_ = uVar67;
                local_1020._12_4_ = uVar67;
                local_1020._16_4_ = uVar67;
                local_1020._20_4_ = uVar67;
                local_1020._24_4_ = uVar67;
                local_1020._28_4_ = uVar67;
                fVar108 = local_11a0[uVar85];
                fVar118 = local_1180[uVar85];
                local_10a0._4_4_ = fVar118;
                local_10a0._0_4_ = fVar118;
                local_10a0._8_4_ = fVar118;
                local_10a0._12_4_ = fVar118;
                local_10a0._16_4_ = fVar118;
                local_10a0._20_4_ = fVar118;
                local_10a0._24_4_ = fVar118;
                local_10a0._28_4_ = fVar118;
                auStack_ff0 = vpshufd_avx(ZEXT416(uVar74),0);
                fVar118 = local_1160[uVar85];
                local_1080._4_4_ = fVar118;
                local_1080._0_4_ = fVar118;
                local_1080._8_4_ = fVar118;
                local_1080._12_4_ = fVar118;
                local_1080._16_4_ = fVar118;
                local_1080._20_4_ = fVar118;
                local_1080._24_4_ = fVar118;
                local_1080._28_4_ = fVar118;
                local_10c0[0] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar108,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar108 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar108 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar108 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                local_1000 = auStack_ff0;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar85 - 8];
                local_1620 = *(undefined8 *)(mm_lookupmask_ps + uVar72);
                uStack_1618 = *(undefined8 *)(mm_lookupmask_ps + uVar72 + 8);
                local_1610 = *(undefined8 *)(mm_lookupmask_ps + lVar73);
                uStack_1608 = *(undefined8 *)(mm_lookupmask_ps + lVar73 + 8);
                local_15f0.valid = (int *)&local_1620;
                local_15f0.geometryUserPtr = pGVar7->userPtr;
                local_15f0.context = context->user;
                local_15f0.hit = local_10c0;
                local_15f0.N = 8;
                local_15f0.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar112 = ZEXT1632(auVar176._0_16_);
                  (*pGVar7->intersectionFilterN)(&local_15f0);
                  auVar104 = ZEXT3264(auVar104._0_32_);
                  auVar112 = vcmpps_avx(auVar112,auVar112,0xf);
                  auVar176 = ZEXT3264(auVar112);
                }
                auVar34._8_8_ = uStack_1618;
                auVar34._0_8_ = local_1620;
                auVar98 = vpcmpeqd_avx((undefined1  [16])0x0,auVar34);
                auVar64._8_8_ = uStack_1608;
                auVar64._0_8_ = local_1610;
                auVar110 = vpcmpeqd_avx((undefined1  [16])0x0,auVar64);
                auVar101._16_16_ = auVar110;
                auVar101._0_16_ = auVar98;
                auVar112 = auVar176._0_32_ & ~auVar101;
                if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar112 >> 0x7f,0) == '\0') &&
                      (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar112 >> 0xbf,0) == '\0') &&
                    (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar112[0x1f]) {
                  auVar102._0_4_ = auVar98._0_4_ ^ auVar176._0_4_;
                  auVar102._4_4_ = auVar98._4_4_ ^ auVar176._4_4_;
                  auVar102._8_4_ = auVar98._8_4_ ^ auVar176._8_4_;
                  auVar102._12_4_ = auVar98._12_4_ ^ auVar176._12_4_;
                  auVar102._16_4_ = auVar110._0_4_ ^ auVar176._16_4_;
                  auVar102._20_4_ = auVar110._4_4_ ^ auVar176._20_4_;
                  auVar102._24_4_ = auVar110._8_4_ ^ auVar176._24_4_;
                  auVar102._28_4_ = auVar110._12_4_ ^ auVar176._28_4_;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar112 = ZEXT1632(auVar176._0_16_);
                    (*p_Var11)(&local_15f0);
                    auVar104 = ZEXT3264(auVar104._0_32_);
                    auVar112 = vcmpps_avx(auVar112,auVar112,0xf);
                    auVar176 = ZEXT3264(auVar112);
                  }
                  auVar63._8_8_ = uStack_1618;
                  auVar63._0_8_ = local_1620;
                  auVar98 = vpcmpeqd_avx((undefined1  [16])0x0,auVar63);
                  auVar65._8_8_ = uStack_1608;
                  auVar65._0_8_ = local_1610;
                  auVar110 = vpcmpeqd_avx((undefined1  [16])0x0,auVar65);
                  auVar116._16_16_ = auVar110;
                  auVar116._0_16_ = auVar98;
                  auVar102._0_4_ = auVar98._0_4_ ^ auVar176._0_4_;
                  auVar102._4_4_ = auVar98._4_4_ ^ auVar176._4_4_;
                  auVar102._8_4_ = auVar98._8_4_ ^ auVar176._8_4_;
                  auVar102._12_4_ = auVar98._12_4_ ^ auVar176._12_4_;
                  auVar102._16_4_ = auVar110._0_4_ ^ auVar176._16_4_;
                  auVar102._20_4_ = auVar110._4_4_ ^ auVar176._20_4_;
                  auVar102._24_4_ = auVar110._8_4_ ^ auVar176._24_4_;
                  auVar102._28_4_ = auVar110._12_4_ ^ auVar176._28_4_;
                  auVar112 = auVar176._0_32_ & ~auVar116;
                  if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar112 >> 0x7f,0) != '\0') ||
                        (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar112 >> 0xbf,0) != '\0') ||
                      (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar112[0x1f] < '\0') {
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])local_15f0.hit);
                    *(undefined1 (*) [32])(local_15f0.ray + 0x180) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0x20)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1a0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0x40)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1c0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0x60)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x1e0) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0x80)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x200) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0xa0)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x220) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0xc0)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x240) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_15f0.hit + 0xe0)
                                             );
                    *(undefined1 (*) [32])(local_15f0.ray + 0x260) = auVar112;
                    auVar112 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])
                                                        (local_15f0.hit + 0x100));
                    *(undefined1 (*) [32])(local_15f0.ray + 0x280) = auVar112;
                  }
                }
                if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar102 >> 0x7f,0) == '\0') &&
                      (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar102 >> 0xbf,0) == '\0') &&
                    (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar102[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar67;
                }
                *(undefined4 *)(local_15c0 + uVar85 * 4) = 0;
                uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar103._4_4_ = uVar67;
                auVar103._0_4_ = uVar67;
                auVar103._8_4_ = uVar67;
                auVar103._12_4_ = uVar67;
                auVar103._16_4_ = uVar67;
                auVar103._20_4_ = uVar67;
                auVar103._24_4_ = uVar67;
                auVar103._28_4_ = uVar67;
                auVar112 = vcmpps_avx(auVar104._0_32_,auVar103,2);
                local_15c0 = vandps_avx(auVar112,local_15c0);
              }
              if ((((((((local_15c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_15c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_15c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_15c0 >> 0x7f,0) == '\0') &&
                    (local_15c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_15c0 >> 0xbf,0) == '\0') &&
                  (local_15c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_15c0[0x1f]) goto LAB_003ed3d4;
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar115,auVar104._0_32_,local_15c0);
              auVar147 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar147 = vminps_avx(auVar112,auVar147);
              auVar27 = vshufpd_avx(auVar147,auVar147,5);
              auVar147 = vminps_avx(auVar147,auVar27);
              auVar27 = vperm2f128_avx(auVar147,auVar147,1);
              auVar147 = vminps_avx(auVar147,auVar27);
              auVar147 = vcmpps_avx(auVar112,auVar147,0);
              auVar27 = local_15c0 & auVar147;
              auVar112 = local_15c0;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar147,local_15c0);
              }
              uVar68 = vmovmskps_avx(auVar112);
              uVar74 = 0;
              if (uVar68 != 0) {
                for (; (uVar68 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              goto LAB_003ecf7a;
            }
          }
        }
LAB_003ed3d4:
        lVar71 = lVar71 + 1;
      } while (lVar71 != uVar69 - 8);
    }
    uVar67 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar104 = ZEXT1664(CONCAT412(uVar67,CONCAT48(uVar67,CONCAT44(uVar67,uVar67))));
    auVar179 = ZEXT1664(local_1370);
    auVar183 = ZEXT1664(local_1380);
    auVar201 = ZEXT1664(local_1390);
    auVar209 = ZEXT1664(local_13a0);
    auVar212 = ZEXT1664(local_13b0);
    auVar222 = ZEXT1664(local_13c0);
    auVar237 = ZEXT1664(local_13d0);
    auVar246 = ZEXT1664(local_13e0);
    auVar248 = ZEXT1664(local_13f0);
    auVar176 = ZEXT1664(local_1590);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }